

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.cpp
# Opt level: O2

void Diligent::CorrectGraphicsPipelineDesc
               (GraphicsPipelineDesc *GraphicsPipeline,DeviceFeatures *Features)

{
  Bool BVar1;
  ulong uVar2;
  long lVar3;
  byte bVar4;
  BlendStateDesc *BlendDesc;
  byte bVar5;
  anon_class_8_1_22d63d35 CorrectStencilOpDesc;
  anon_class_8_1_22d63d35 local_18;
  
  for (uVar2 = (ulong)GraphicsPipeline->NumRenderTargets; uVar2 < 8; uVar2 = uVar2 + 1) {
    GraphicsPipeline->RTVFormats[uVar2] = TEX_FORMAT_UNKNOWN;
  }
  BVar1 = (GraphicsPipeline->BlendDesc).IndependentBlendEnable;
  lVar3 = 0;
  do {
    if (lVar3 == 0x50) {
      if (((GraphicsPipeline->RasterizerDesc).DepthClipEnable == false) &&
         (Features->DepthClamp == DEVICE_FEATURE_STATE_DISABLED)) {
        (GraphicsPipeline->RasterizerDesc).DepthClipEnable = true;
      }
      local_18.DSSDesc = &GraphicsPipeline->DepthStencilDesc;
      if (((GraphicsPipeline->DepthStencilDesc).DepthEnable == false) &&
         ((GraphicsPipeline->DepthStencilDesc).DepthFunc == COMPARISON_FUNC_UNKNOWN)) {
        (GraphicsPipeline->DepthStencilDesc).DepthFunc = COMPARISON_FUNC_LESS;
      }
      anon_unknown_61::CorrectDepthStencilDesc::anon_class_8_1_22d63d35::operator()
                (&local_18,&(GraphicsPipeline->DepthStencilDesc).FrontFace);
      anon_unknown_61::CorrectDepthStencilDesc::anon_class_8_1_22d63d35::operator()
                (&local_18,&(GraphicsPipeline->DepthStencilDesc).BackFace);
      return;
    }
    if ((&(GraphicsPipeline->BlendDesc).RenderTargets[0].BlendEnable)[lVar3] == true) {
      bVar5 = BVar1;
      if (lVar3 != 0) goto LAB_005b817c;
      bVar4 = (GraphicsPipeline->BlendDesc).RenderTargets[0].LogicOperationEnable;
    }
    else {
      bVar5 = 0;
LAB_005b817c:
      bVar4 = (lVar3 == 0 | BVar1) &
              (&(GraphicsPipeline->BlendDesc).RenderTargets[0].LogicOperationEnable)[lVar3];
      if ((bVar5 & 1) == 0) {
        if ((&(GraphicsPipeline->BlendDesc).RenderTargets[0].SrcBlend)[lVar3] ==
            BLEND_FACTOR_UNDEFINED) {
          (&(GraphicsPipeline->BlendDesc).RenderTargets[0].SrcBlend)[lVar3] = BLEND_FACTOR_ONE;
        }
        if ((&(GraphicsPipeline->BlendDesc).RenderTargets[0].DestBlend)[lVar3] ==
            BLEND_FACTOR_UNDEFINED) {
          (&(GraphicsPipeline->BlendDesc).RenderTargets[0].DestBlend)[lVar3] = BLEND_FACTOR_ZERO;
        }
        if ((&(GraphicsPipeline->BlendDesc).RenderTargets[0].BlendOp)[lVar3] ==
            BLEND_OPERATION_UNDEFINED) {
          (&(GraphicsPipeline->BlendDesc).RenderTargets[0].BlendOp)[lVar3] = BLEND_OPERATION_ADD;
        }
        if ((&(GraphicsPipeline->BlendDesc).RenderTargets[0].SrcBlendAlpha)[lVar3] ==
            BLEND_FACTOR_UNDEFINED) {
          (&(GraphicsPipeline->BlendDesc).RenderTargets[0].SrcBlendAlpha)[lVar3] = BLEND_FACTOR_ONE;
        }
        if ((&(GraphicsPipeline->BlendDesc).RenderTargets[0].DestBlendAlpha)[lVar3] ==
            BLEND_FACTOR_UNDEFINED) {
          (&(GraphicsPipeline->BlendDesc).RenderTargets[0].DestBlendAlpha)[lVar3] =
               BLEND_FACTOR_ZERO;
        }
        if ((&(GraphicsPipeline->BlendDesc).RenderTargets[0].BlendOpAlpha)[lVar3] ==
            BLEND_OPERATION_UNDEFINED) {
          (&(GraphicsPipeline->BlendDesc).RenderTargets[0].BlendOpAlpha)[lVar3] =
               BLEND_OPERATION_ADD;
        }
      }
    }
    if (bVar4 == 0) {
      (&(GraphicsPipeline->BlendDesc).RenderTargets[0].LogicOp)[lVar3] = LOGIC_OP_NOOP;
    }
    lVar3 = lVar3 + 10;
  } while( true );
}

Assistant:

void CorrectGraphicsPipelineDesc(GraphicsPipelineDesc& GraphicsPipeline, const DeviceFeatures& Features) noexcept
{
    for (size_t rt = GraphicsPipeline.NumRenderTargets; rt < _countof(GraphicsPipeline.RTVFormats); ++rt)
        GraphicsPipeline.RTVFormats[rt] = TEX_FORMAT_UNKNOWN;

    CorrectBlendStateDesc(GraphicsPipeline);
    CorrectRasterizerStateDesc(GraphicsPipeline, Features);
    CorrectDepthStencilDesc(GraphicsPipeline);
}